

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

FilePathSpecSyntax * __thiscall slang::parsing::Parser::parseFilePathSpec(Parser *this)

{
  Token path_00;
  span<char,_18446744073709551615UL> text_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  bool bVar1;
  undefined1 uVar2;
  undefined8 *in_RDI;
  string_view sVar4;
  Token TVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  Token TVar8;
  Token path;
  Token first;
  SmallVector<char,_40UL> text;
  anon_class_8_1_8991fb9c nextIsValidPathToken;
  Token path_1;
  Token lit;
  ParserBase *in_stack_fffffffffffffda8;
  size_t sVar9;
  SmallVectorBase<char> *in_stack_fffffffffffffdb0;
  Info *pIVar10;
  undefined6 in_stack_fffffffffffffdb8;
  TokenKind in_stack_fffffffffffffdbe;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdc0;
  ParserBase *in_stack_fffffffffffffdd0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  TokenKind TVar11;
  BumpAllocator *in_stack_fffffffffffffdf0;
  Token *in_stack_fffffffffffffdf8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe00;
  pointer in_stack_fffffffffffffe08;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffffe27;
  char *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe38;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffe40;
  Token local_e8 [2];
  undefined1 local_c1;
  SmallVectorBase<char> local_c0 [2];
  Token local_80;
  undefined8 local_68;
  undefined8 local_60;
  SourceLocation local_58;
  string_view local_50;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_40;
  undefined8 local_30;
  undefined8 local_28;
  Token local_20;
  FilePathSpecSyntax *local_8;
  char *pcVar3;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffe38 >> 0x30);
  TVar11 = (TokenKind)((ulong)in_stack_fffffffffffffde8 >> 0x30);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdc0._M_extent_value,
                           in_stack_fffffffffffffdbe);
  if (bVar1) {
    local_20 = ParserBase::consume(in_stack_fffffffffffffdd0);
    local_40 = Token::trivia((Token *)in_stack_fffffffffffffdd0);
    local_50 = Token::rawText((Token *)in_stack_fffffffffffffdc0._M_extent_value);
    local_58 = Token::location(&local_20);
    sVar7._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
    sVar7._M_ptr = in_stack_fffffffffffffe08;
    sVar4._M_len._6_1_ = in_stack_fffffffffffffe26;
    sVar4._M_len._0_6_ = in_stack_fffffffffffffe20;
    sVar4._M_len._7_1_ = in_stack_fffffffffffffe27;
    sVar4._M_str = in_stack_fffffffffffffe28;
    sVar9 = local_50._M_len;
    pIVar10 = (Info *)local_50._M_str;
    Token::Token(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,TVar11,sVar7,sVar4,
                 (SourceLocation)in_stack_fffffffffffffe00._M_extent_value);
    local_68 = local_30;
    local_60 = local_28;
    TVar8.info = pIVar10;
    TVar8.kind = (short)sVar9;
    TVar8._2_1_ = (char)(sVar9 >> 0x10);
    TVar8.numFlags.raw = (char)(sVar9 >> 0x18);
    TVar8.rawLen = (int)(sVar9 >> 0x20);
    local_8 = slang::syntax::SyntaxFactory::filePathSpec((SyntaxFactory *)0x8be4e2,TVar8);
  }
  else {
    bVar1 = parseFilePathSpec::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffffdd8);
    if (bVar1) {
      SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x8be582);
      local_c1 = 0x22;
      SmallVectorBase<char>::push_back(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      local_e8[0] = ParserBase::peek(in_stack_fffffffffffffda8);
      sVar6._M_extent._M_extent_value = in_stack_fffffffffffffe00._M_extent_value;
      sVar6._M_ptr = in_stack_fffffffffffffe08;
      do {
        ParserBase::consume(in_stack_fffffffffffffdd0);
        sVar4 = Token::rawText((Token *)in_stack_fffffffffffffdc0._M_extent_value);
        pcVar3 = sVar4._M_str;
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ((SmallVectorBase<char> *)in_stack_fffffffffffffdc0._M_extent_value,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT26(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8));
        uVar2 = parseFilePathSpec::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffffdd8);
        uVar12 = false;
        if ((bool)uVar2) {
          TVar5 = ParserBase::peek(in_stack_fffffffffffffda8);
          in_stack_fffffffffffffe10._M_extent_value = (size_t)TVar5.info;
          sVar6 = Token::trivia((Token *)in_stack_fffffffffffffdd0);
          uVar12 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                             ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x8be70e
                             );
        }
      } while ((bool)uVar12 != false);
      SmallVectorBase<char>::push_back(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      TVar11 = (TokenKind)((ulong)*in_RDI >> 0x30);
      sVar7 = Token::trivia((Token *)in_stack_fffffffffffffdd0);
      SmallVectorBase<char>::copy(local_c0,(EVP_PKEY_CTX *)*in_RDI,(EVP_PKEY_CTX *)sVar7._M_ptr);
      text_00._M_ptr._6_2_ = in_stack_fffffffffffffdbe;
      text_00._M_ptr._0_6_ = in_stack_fffffffffffffdb8;
      text_00._M_extent._M_extent_value = in_stack_fffffffffffffdc0._M_extent_value;
      TVar8 = (Token)toStringView(text_00);
      Token::location(local_e8);
      trivia._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
      trivia._M_ptr = sVar6._M_ptr;
      rawText._M_len._6_1_ = uVar12;
      rawText._M_len._0_6_ = in_stack_fffffffffffffe20;
      rawText._M_len._7_1_ = uVar2;
      rawText._M_str = pcVar3;
      Token::Token((Token *)sVar7._M_ptr,
                   (BumpAllocator *)sVar7._M_extent._M_extent_value._M_extent_value,TVar11,trivia,
                   rawText,(SourceLocation)sVar6._M_extent._M_extent_value._M_extent_value);
      local_8 = slang::syntax::SyntaxFactory::filePathSpec((SyntaxFactory *)0x8be88d,TVar8);
      SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x8be8ae);
    }
    else {
      local_80 = ParserBase::expect(in_stack_fffffffffffffe40,kind);
      path_00.info = (Info *)in_stack_fffffffffffffdb0;
      path_00._0_8_ = in_stack_fffffffffffffda8;
      local_8 = slang::syntax::SyntaxFactory::filePathSpec((SyntaxFactory *)0x8be560,path_00);
    }
  }
  return local_8;
}

Assistant:

FilePathSpecSyntax& Parser::parseFilePathSpec() {
    if (peek(TokenKind::StringLiteral)) {
        auto lit = consume();
        auto path = Token(alloc, TokenKind::IncludeFileName, lit.trivia(), lit.rawText(),
                          lit.location());
        return factory.filePathSpec(path);
    }

    auto nextIsValidPathToken = [&] {
        switch (peek().kind) {
            case TokenKind::Minus:
                return peek(1).kind != TokenKind::IncDirKeyword;
            case TokenKind::Comma:
            case TokenKind::Semicolon:
            case TokenKind::EndOfFile:
                return false;
            default:
                return true;
        }
    };

    if (!nextIsValidPathToken())
        return factory.filePathSpec(expect(TokenKind::IncludeFileName));

    SmallVector<char> text;
    text.push_back('"');

    auto first = peek();
    do {
        text.append_range(consume().rawText());
    } while (nextIsValidPathToken() && peek().trivia().empty());

    text.push_back('"');

    auto path = Token(alloc, TokenKind::IncludeFileName, first.trivia(),
                      toStringView(text.copy(alloc)), first.location());
    return factory.filePathSpec(path);
}